

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_reset(pt_event_decoder *decoder)

{
  pt_event_decoder *decoder_local;
  
  if (decoder == (pt_event_decoder *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    (decoder->packet).type = ppt_invalid;
    decoder->status = -3;
    decoder->event = (pt_event *)0x0;
    decoder->field_0x72c = decoder->field_0x72c & 0xef;
    decoder->field_0x72c = decoder->field_0x72c & 0xdf;
    decoder->field_0x72c = decoder->field_0x72c & 0xfe;
    pt_last_ip_init(&decoder->ip);
    pt_time_init(&decoder->time);
    pt_tcal_init(&decoder->tcal);
    pt_evq_init(&decoder->evq);
    decoder_local._4_4_ = 0;
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_evt_reset(struct pt_event_decoder *decoder)
{
	if (!decoder)
		return -pte_internal;

	decoder->packet.type = ppt_invalid;
	decoder->status = -pte_nosync;
	decoder->event = NULL;
	decoder->enabled = 0;
	decoder->bound = 0;
	decoder->mode_exec_valid = 0;

	pt_last_ip_init(&decoder->ip);
	pt_time_init(&decoder->time);
	pt_tcal_init(&decoder->tcal);
	pt_evq_init(&decoder->evq);

	return 0;
}